

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void google::protobuf::internal::MapFieldBase::UnsafeShallowSwapImpl
               (MapFieldBase *lhs,MapFieldBase *rhs)

{
  Arena **v1;
  Arena **v2;
  LogMessage *pLVar1;
  undefined1 auVar2 [16];
  LogMessageFatal local_48 [23];
  Voidify local_31;
  Arena *local_30;
  Arena *local_28;
  string *local_20;
  string *absl_log_internal_check_op_result;
  MapFieldBase *rhs_local;
  MapFieldBase *lhs_local;
  
  absl_log_internal_check_op_result = (string *)rhs;
  rhs_local = lhs;
  local_28 = arena(lhs);
  v1 = absl::lts_20240722::log_internal::GetReferenceableValue<google::protobuf::Arena*>(&local_28);
  local_30 = arena((MapFieldBase *)absl_log_internal_check_op_result);
  v2 = absl::lts_20240722::log_internal::GetReferenceableValue<google::protobuf::Arena*>(&local_30);
  local_20 = absl::lts_20240722::log_internal::
             Check_EQImpl<google::protobuf::Arena*,google::protobuf::Arena*>
                       (v1,v2,"lhs.arena() == rhs.arena()");
  if (local_20 != (string *)0x0) {
    auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_20);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/map_field.cc"
               ,0x91,auVar2._0_8_,auVar2._8_8_);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_48);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_31,pLVar1);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_48);
  }
  InternalSwap(rhs_local,(MapFieldBase *)absl_log_internal_check_op_result);
  return;
}

Assistant:

void MapFieldBase::UnsafeShallowSwapImpl(MapFieldBase& lhs, MapFieldBase& rhs) {
  ABSL_DCHECK_EQ(lhs.arena(), rhs.arena());
  lhs.InternalSwap(&rhs);
}